

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O0

uint32_t __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadAttribute<unsigned_int>(OgreXmlSerializer *this,char *name)

{
  XmlReader *pXVar1;
  char *pcVar2;
  bool bVar3;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  uint32_t local_1c;
  char *pcStack_18;
  int32_t temp;
  char *name_local;
  OgreXmlSerializer *this_local;
  
  pcStack_18 = name;
  name_local = (char *)this;
  bVar3 = HasAttribute(this,name);
  pcVar2 = pcStack_18;
  if (!bVar3) {
    pXVar1 = this->m_reader;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a0,pcVar2,&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"",&local_c9);
    ThrowAttibuteError(pXVar1,&local_a0,&local_c8);
  }
  local_1c = ReadAttribute<int>(this,pcStack_18);
  pcVar2 = pcStack_18;
  if (-1 < (int)local_1c) {
    return local_1c;
  }
  pXVar1 = this->m_reader;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,pcVar2,&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_78,"Found a negative number value where expecting a uint32_t value",
             &local_79);
  ThrowAttibuteError(pXVar1,&local_40,&local_78);
}

Assistant:

uint32_t OgreXmlSerializer::ReadAttribute<uint32_t>(const char *name) const
{
    if (HasAttribute(name))
    {
        /** @note This is hackish. But we are never expecting unsigned values that go outside the
            int32_t range. Just monitor for negative numbers and kill the import. */
        int32_t temp = ReadAttribute<int32_t>(name);
        if (temp >= 0)
        {
            return static_cast<uint32_t>(temp);
        }
        else
        {
            ThrowAttibuteError(m_reader, name, "Found a negative number value where expecting a uint32_t value");
        }
    }
    else
    {
        ThrowAttibuteError(m_reader, name);
    }
    return 0;
}